

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# verilogAST.cpp
# Opt level: O0

string * verilogAST::add_tab(string *__return_storage_ptr__,string *block)

{
  byte bVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_210;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f0;
  undefined1 local_1d0 [8];
  string line;
  istringstream local_198 [8];
  istringstream block_stream;
  string *block_local;
  string *new_block;
  
  std::__cxx11::istringstream::istringstream(local_198,block,8);
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  while (bVar1 = std::ios::eof(), ((bVar1 ^ 0xff) & 1) != 0) {
    std::__cxx11::string::string((string *)local_1d0);
    std::getline<char,std::char_traits<char>,std::allocator<char>>
              ((istream *)local_198,(string *)local_1d0);
    std::operator+(&local_210,"    ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1d0);
    std::operator+(&local_1f0,&local_210,"\n");
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_1f0);
    std::__cxx11::string::~string((string *)&local_1f0);
    std::__cxx11::string::~string((string *)&local_210);
    std::__cxx11::string::~string((string *)local_1d0);
  }
  std::__cxx11::istringstream::~istringstream(local_198);
  return __return_storage_ptr__;
}

Assistant:

std::string add_tab(std::string block) {
  // Indents each line by four spaces, adds an extra newline at the end
  std::istringstream block_stream(block);
  std::string new_block;
  while (!block_stream.eof()) {
    std::string line;
    std::getline(block_stream, line);
    new_block += "    " + line + "\n";
  }
  return new_block;
}